

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_sfp.c
# Opt level: O0

int csp_sfp_recv_fp(csp_conn_t *conn,void **return_data,int *return_datasize,uint32_t timeout,
                   csp_packet_t *first_packet)

{
  uint *in_RDX;
  undefined8 *in_RSI;
  csp_packet_t *in_R8;
  sfp_header_t *sfp_header;
  int error;
  uint32_t data_offset;
  uint32_t datasize;
  uint8_t *data;
  csp_packet_t *packet;
  csp_packet_t *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar1;
  undefined4 in_stack_ffffffffffffffbc;
  uint uVar2;
  void *local_40;
  csp_packet_t *local_38;
  uint32_t local_4;
  
  *in_RSI = 0;
  *in_RDX = 0;
  local_38 = in_R8;
  if ((in_R8 == (csp_packet_t *)0x0) &&
     (local_38 = csp_read((csp_conn_t *)
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                          in_stack_ffffffffffffffb4), local_38 == (csp_packet_t *)0x0)) {
    local_4 = 0xfffffffd;
  }
  else {
    local_40 = (void *)0x0;
    uVar2 = 0;
    uVar1 = 0;
    local_4 = 0xfffffffd;
    do {
      in_stack_ffffffffffffffa8 = (csp_packet_t *)csp_sfp_header_remove(in_stack_ffffffffffffffa8);
      if (in_stack_ffffffffffffffa8 == (csp_packet_t *)0x0) {
        csp_buffer_free((void *)CONCAT44(local_4,in_stack_ffffffffffffffb0));
        local_4 = 0xffffff99;
        break;
      }
      if (in_stack_ffffffffffffffa8->timestamp_tx != uVar1) {
        csp_buffer_free((void *)CONCAT44(local_4,in_stack_ffffffffffffffb0));
        local_4 = 0xffffff99;
        break;
      }
      if (local_40 == (void *)0x0) {
        uVar2 = *(uint *)&in_stack_ffffffffffffffa8->field_0x4;
        local_40 = malloc((ulong)uVar2);
        if (local_40 == (void *)0x0) {
          csp_buffer_free((void *)CONCAT44(local_4,in_stack_ffffffffffffffb0));
          local_4 = 0xffffffff;
          break;
        }
      }
      if ((uVar2 < uVar1 + local_38->length) ||
         (uVar2 != *(uint32_t *)&in_stack_ffffffffffffffa8->field_0x4)) {
        csp_buffer_free((void *)CONCAT44(local_4,in_stack_ffffffffffffffb0));
        local_4 = 0xffffff99;
        break;
      }
      memcpy((void *)((long)local_40 + (ulong)uVar1),&local_38->field_12,(ulong)local_38->length);
      uVar1 = local_38->length + uVar1;
      if (uVar2 <= uVar1) {
        csp_buffer_free((void *)CONCAT44(local_4,in_stack_ffffffffffffffb0));
        *in_RSI = local_40;
        *in_RDX = uVar2;
        return 0;
      }
      if (local_38->length == 0) {
        csp_buffer_free((void *)CONCAT44(local_4,in_stack_ffffffffffffffb0));
        local_4 = 0xffffff99;
        break;
      }
      csp_buffer_free((void *)CONCAT44(local_4,in_stack_ffffffffffffffb0));
      local_38 = csp_read((csp_conn_t *)CONCAT44(uVar2,uVar1),local_4);
    } while (local_38 != (csp_packet_t *)0x0);
    free(local_40);
  }
  return local_4;
}

Assistant:

int csp_sfp_recv_fp(csp_conn_t * conn, void ** return_data, int * return_datasize, uint32_t timeout, csp_packet_t * first_packet) {

	*return_data = NULL; /* Allow caller to assume csp_free() can always be called when dataout is non-NULL */
	*return_datasize = 0;

	/* Get first packet from user, or from connection */
	csp_packet_t * packet;
	if (first_packet == NULL) {
		packet = csp_read(conn, timeout);
		if (packet == NULL) {
			return CSP_ERR_TIMEDOUT;
		}
	} else {
		packet = first_packet;
	}

	uint8_t * data = NULL;
	uint32_t datasize = 0;
	uint32_t data_offset = 0;
	int error = CSP_ERR_TIMEDOUT;
	do {
		/* Read SFP header */
		sfp_header_t * sfp_header = csp_sfp_header_remove(packet);
		if (sfp_header == NULL) {
			//csp_print("%s: %u:%u, invalid message, id.flags: 0x%x, length: %u\n", __func__, packet->id.src, packet->id.sport, packet->id.flags, packet->length);
			csp_buffer_free(packet);

			error = CSP_ERR_SFP;
			goto error;
		}

		//csp_print("%s: %u:%u, fragment %" PRIu32 "/%" PRIu32 "\n",  __func__, packet->id.src, packet->id.sport, sfp_header->offset + packet->length, sfp_header->totalsize);

		/* Consistency check */
		if (sfp_header->offset != data_offset) {
			//csp_print("%s: %u:%u, invalid message, offset %" PRIu32 " (expected %" PRIu32 "), length: %u, totalsize %" PRIu32 "\n", __func__, packet->id.src, packet->id.sport, sfp_header->offset, data_offset, packet->length, sfp_header->totalsize);
			csp_buffer_free(packet);

			error = CSP_ERR_SFP;
			goto error;
		}

		/* Allocate memory */
		if (data == NULL) {
			datasize = sfp_header->totalsize;
			data = malloc(datasize);
			if (data == NULL) {
				//csp_print("%s: %u:%u, malloc(%" PRIu32 ") failed\n", __func__, packet->id.src, packet->id.sport, datasize);
				csp_buffer_free(packet);

				error = CSP_ERR_NOMEM;
				goto error;
			}
		}

		/* Consistency check */
		if (((data_offset + packet->length) > datasize) || (datasize != sfp_header->totalsize)) {
			//csp_print("%s: %u:%u, invalid size, sfp.offset: %" PRIu32 ", length: %u, total: %" PRIu32 " / %" PRIu32 "\n", __func__, packet->id.src, packet->id.sport, sfp_header->offset, packet->length, datasize, sfp_header->totalsize);
			csp_buffer_free(packet);

			error = CSP_ERR_SFP;
			goto error;
		}

		/* Copy data to output */
		memcpy(data + data_offset, packet->data, packet->length);
		data_offset += packet->length;

		if (data_offset >= datasize) {
			// transfer complete
			csp_buffer_free(packet);

			*return_data = data;  // must be freed by csp_free()
			*return_datasize = datasize;
			return CSP_ERR_NONE;
		}

		/* Consistency check */
		if (packet->length == 0) {
			//csp_print("%s: %u:%u, invalid size, sfp.offset: %" PRIu32 ", length: %u, total: %" PRIu32 " / %" PRIu32 "\n", __func__, packet->id.src, packet->id.sport, sfp_header->offset, packet->length, datasize, sfp_header->totalsize);
			csp_buffer_free(packet);

			error = CSP_ERR_SFP;
			goto error;
		}

		csp_buffer_free(packet);

	} while ((packet = csp_read(conn, timeout)) != NULL);

error:
	free(data);
	return error;
}